

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O2

Entry * __thiscall
cali::CompressedSnapshotRecordView::unpack_next_entry
          (Entry *__return_storage_ptr__,CompressedSnapshotRecordView *this,
          CaliperMetadataAccessInterface *c,size_t *n,size_t *pos)

{
  anon_union_8_7_33918203_for_value aVar1;
  int iVar2;
  uint64_t uVar3;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  cali_variant_t cVar7;
  Node *pNVar4;
  
  uVar5 = *n;
  if (uVar5 == 0) {
    *pos = 1;
    uVar5 = *n;
  }
  uVar6 = this->m_num_nodes;
  if (uVar5 < uVar6) {
    *n = uVar5 + 1;
    uVar3 = vldec_u64(this->m_buffer + *pos,pos);
    iVar2 = (**c->_vptr_CaliperMetadataAccessInterface)(c,uVar3);
    pNVar4 = (Node *)CONCAT44(extraout_var,iVar2);
    __return_storage_ptr__->m_node = pNVar4;
    aVar1 = (pNVar4->m_data).m_v.value;
    (__return_storage_ptr__->m_value).m_v.type_and_size = (pNVar4->m_data).m_v.type_and_size;
    (__return_storage_ptr__->m_value).m_v.value = aVar1;
  }
  else {
    if (uVar5 == uVar6) {
      *pos = this->m_imm_pos + 1;
      uVar5 = *n;
      uVar6 = this->m_num_nodes;
    }
    if (uVar5 < uVar6 + this->m_num_imm) {
      *n = uVar5 + 1;
      uVar3 = vldec_u64(this->m_buffer + *pos,pos);
      cVar7 = cali_variant_unpack(this->m_buffer + *pos,pos,(_Bool *)0x0);
      iVar2 = (*c->_vptr_CaliperMetadataAccessInterface[1])(c,uVar3);
      __return_storage_ptr__->m_node = (Node *)CONCAT44(extraout_var_00,iVar2);
      (__return_storage_ptr__->m_value).m_v = cVar7;
    }
    else {
      __return_storage_ptr__->m_node = (Node *)0x0;
      (__return_storage_ptr__->m_value).m_v.type_and_size = 0;
      (__return_storage_ptr__->m_value).m_v.value.v_uint = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Entry CompressedSnapshotRecordView::unpack_next_entry(const CaliperMetadataAccessInterface* c, size_t& n, size_t& pos)
{
    if (n == 0)
        pos = 1;

    if (n < m_num_nodes) {
        ++n;
        return Entry(c->node(vldec_u64(m_buffer + pos, &pos)));
    }

    if (n == m_num_nodes)
        pos = m_imm_pos + 1;

    if (n < m_num_nodes + m_num_imm) {
        ++n;

        cali_id_t id   = vldec_u64(m_buffer + pos, &pos);
        Variant   data = Variant::unpack(m_buffer + pos, &pos, nullptr);

        return Entry(c->get_attribute(id), data);
    }

    return Entry();
}